

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_landscape_on_grid.h
# Opt level: O1

void __thiscall
Gudhi::Persistence_representations::Persistence_landscape_on_grid::Persistence_landscape_on_grid
          (Persistence_landscape_on_grid *this,char *filename,size_t number_of_points_,
          uint number_of_levels_of_landscape,uint16_t dimension)

{
  pointer ppVar1;
  pointer ppVar2;
  long lVar3;
  double *pdVar4;
  undefined2 in_register_00000082;
  double grid_min_;
  double grid_max_;
  double dVar5;
  double dVar6;
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> p;
  allocator<char> local_79;
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> local_78;
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> local_58;
  string local_40;
  
  (this->values_of_landscapes).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->values_of_landscapes).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->values_of_landscapes).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  if (CONCAT22(in_register_00000082,dimension) == 0xffff) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,filename,&local_79);
    read_persistence_intervals_in_one_dimension_from_file(&local_58,&local_40,-1,-1.0);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,filename,&local_79);
    read_persistence_intervals_in_one_dimension_from_file
              (&local_58,&local_40,CONCAT22(in_register_00000082,dimension),-1.0);
  }
  ppVar2 = local_78.
           super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  ppVar1 = local_78.
           super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_78.
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl
  .super__Vector_impl_data._M_start =
       local_58.
       super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_78.
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl
  .super__Vector_impl_data._M_finish =
       local_58.
       super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_78.
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage =
       local_58.
       super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_58.
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (ppVar1 != (pointer)0x0) {
    operator_delete(ppVar1,(long)ppVar2 - (long)ppVar1);
  }
  if (local_58.
      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.
                    super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.
                          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.
                          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  ppVar1 = local_78.
           super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((long)local_78.
            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_78.
            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
            ._M_impl.super__Vector_impl_data._M_start == 0) {
    grid_max_ = -1.79769313486232e+308;
    grid_min_ = 1.79769313486232e+308;
  }
  else {
    lVar3 = (long)local_78.
                  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_78.
                  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4;
    pdVar4 = &(local_78.
               super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->second;
    dVar5 = -1.79769313486232e+308;
    dVar6 = 1.79769313486232e+308;
    do {
      grid_min_ = ((pair<double,_double> *)(pdVar4 + -1))->first;
      if (dVar6 <= ((pair<double,_double> *)(pdVar4 + -1))->first) {
        grid_min_ = dVar6;
      }
      grid_max_ = *pdVar4;
      if (*pdVar4 <= dVar5) {
        grid_max_ = dVar5;
      }
      pdVar4 = pdVar4 + 2;
      lVar3 = lVar3 + -1;
      dVar5 = grid_max_;
      dVar6 = grid_min_;
    } while (lVar3 != 0);
  }
  set_up_values_of_landscapes
            (this,&local_78,grid_min_,grid_max_,number_of_points_,number_of_levels_of_landscape);
  if (ppVar1 != (pointer)0x0) {
    operator_delete(ppVar1,(long)local_78.
                                 super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppVar1);
  }
  return;
}

Assistant:

Persistence_landscape_on_grid::Persistence_landscape_on_grid(const char* filename, size_t number_of_points_,
                                                             unsigned number_of_levels_of_landscape,
                                                             uint16_t dimension) {
  std::vector<std::pair<double, double> > p;
  if (dimension == std::numeric_limits<uint16_t>::max()) {
    p = read_persistence_intervals_in_one_dimension_from_file(filename);
  } else {
    p = read_persistence_intervals_in_one_dimension_from_file(filename, dimension);
  }
  double grid_min_ = std::numeric_limits<double>::max();
  double grid_max_ = -std::numeric_limits<double>::max();
  for (size_t i = 0; i != p.size(); ++i) {
    if (p[i].first < grid_min_) grid_min_ = p[i].first;
    if (p[i].second > grid_max_) grid_max_ = p[i].second;
  }
  this->set_up_values_of_landscapes(p, grid_min_, grid_max_, number_of_points_, number_of_levels_of_landscape);
}